

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O0

path * __thiscall
irr::io::CFileSystem::getRelativeFilename(CFileSystem *this,path *filename,path *directory)

{
  bool bVar1;
  u32 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  string<char> *in_RSI;
  path *in_RDI;
  const_iterator it2;
  const_iterator it1;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> list2;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> list1;
  path path2;
  path ext;
  path file;
  path *path1;
  reference in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 uVar3;
  iterator local_148;
  _List_const_iterator<irr::core::string<char>_> local_140;
  iterator local_138;
  _List_const_iterator<irr::core::string<char>_> local_130;
  iterator local_128;
  _List_const_iterator<irr::core::string<char>_> local_120;
  iterator local_118;
  _List_const_iterator<irr::core::string<char>_> local_110;
  iterator local_108;
  _List_const_iterator<irr::core::string<char>_> local_100;
  iterator local_f8;
  _List_const_iterator<irr::core::string<char>_> local_f0;
  _List_const_iterator<irr::core::string<char>_> local_e8;
  _List_const_iterator<irr::core::string<char>_> in_stack_ffffffffffffff20;
  path *in_stack_ffffffffffffff28;
  path *in_stack_ffffffffffffff30;
  path *in_stack_ffffffffffffff38;
  path *in_stack_ffffffffffffff40;
  undefined1 local_a8 [32];
  undefined1 local_88 [26];
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  u32 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
  *in_stack_ffffffffffffffa0;
  string<char> *in_stack_ffffffffffffffa8;
  
  uVar3 = (undefined1)((ulong)in_stack_ffffffffffffff20._M_node >> 0x38);
  bVar1 = core::string<char>::empty((string<char> *)0x381e8e);
  if ((bVar1) || (bVar1 = core::string<char>::empty((string<char> *)0x381e9f), bVar1)) {
    core::string<char>::string
              ((string<char> *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
  }
  else {
    core::string<char>::string((string<char> *)0x381ece);
    core::string<char>::string((string<char> *)0x381edb);
    core::string<char>::string((string<char> *)0x381ee8);
    (**(code **)(*(long *)&in_RSI->str + 0x98))(local_88,in_RSI,in_RDX);
    core::splitFilename(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(bool)uVar3);
    core::string<char>::~string((string<char> *)0x381f38);
    (**(code **)(*(long *)&in_RSI->str + 0x98))(local_a8,in_RSI,in_RCX);
    std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::list
              ((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)0x381f63)
    ;
    std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::list
              ((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)0x381f70)
    ;
    core::string<char>::
    split<std::__cxx11::list<irr::core::string<char>,std::allocator<irr::core::string<char>>>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff94,(bool)in_stack_ffffffffffffff93,
               (bool)in_stack_ffffffffffffff92);
    core::string<char>::
    split<std::__cxx11::list<irr::core::string<char>,std::allocator<irr::core::string<char>>>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff94,(bool)in_stack_ffffffffffffff93,
               (bool)in_stack_ffffffffffffff92);
    std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator
              ((_List_const_iterator<irr::core::string<char>_> *)&stack0xffffffffffffff20);
    std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator(&local_e8);
    local_f8._M_node =
         (_List_node_base *)
         std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
         begin((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
               in_stack_fffffffffffffe88);
    std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator(&local_f0,&local_f8);
    local_108._M_node =
         (_List_node_base *)
         std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
         begin((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
               in_stack_fffffffffffffe88);
    std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator(&local_100,&local_108)
    ;
    local_e8._M_node = local_100._M_node;
    while( true ) {
      local_118._M_node =
           (_List_node_base *)
           std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
           end((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
               in_stack_fffffffffffffe88);
      std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator
                (&local_110,&local_118);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff20,&local_110);
      uVar3 = false;
      if (bVar1) {
        local_128._M_node =
             (_List_node_base *)
             std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
             ::end((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
                   in_stack_fffffffffffffe88);
        std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator
                  (&local_120,&local_128);
        bVar1 = std::operator!=(&local_e8,&local_120);
        uVar3 = false;
        if (bVar1) {
          in_stack_fffffffffffffe88 =
               std::_List_const_iterator<irr::core::string<char>_>::operator*
                         ((_List_const_iterator<irr::core::string<char>_> *)0x3820d4);
          std::_List_const_iterator<irr::core::string<char>_>::operator*
                    ((_List_const_iterator<irr::core::string<char>_> *)0x3820e5);
          uVar3 = core::string<char>::operator==
                            ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),
                             in_stack_fffffffffffffe88);
        }
      }
      if ((bool)uVar3 == false) break;
      std::_List_const_iterator<irr::core::string<char>_>::operator++
                ((_List_const_iterator<irr::core::string<char>_> *)&stack0xffffffffffffff20);
      std::_List_const_iterator<irr::core::string<char>_>::operator++(&local_e8);
    }
    core::string<char>::operator=(in_RSI,(char *)in_RDI);
    while( true ) {
      local_138._M_node =
           (_List_node_base *)
           std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
           end((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
               in_stack_fffffffffffffe88);
      std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator
                (&local_130,&local_138);
      bVar1 = std::operator!=(&local_e8,&local_130);
      if (!bVar1) break;
      core::string<char>::operator+=
                ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),
                 (char *)in_stack_fffffffffffffe88);
      std::_List_const_iterator<irr::core::string<char>_>::operator++(&local_e8);
    }
    while( true ) {
      local_148._M_node =
           (_List_node_base *)
           std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
           end((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
               in_stack_fffffffffffffe88);
      std::_List_const_iterator<irr::core::string<char>_>::_List_const_iterator
                (&local_140,&local_148);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff20,&local_140);
      if (!bVar1) break;
      std::_List_const_iterator<irr::core::string<char>_>::operator++
                ((_List_const_iterator<irr::core::string<char>_> *)&stack0xffffffffffffff20,0);
      std::_List_const_iterator<irr::core::string<char>_>::operator*
                ((_List_const_iterator<irr::core::string<char>_> *)0x3821e1);
      core::string<char>::operator+=
                ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
                );
      core::string<char>::operator+=
                ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),
                 (char)((ulong)in_stack_fffffffffffffe88 >> 0x38));
    }
    core::string<char>::operator+=
              ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
    uVar2 = core::string<char>::size((string<char> *)0x38221e);
    if (uVar2 != 0) {
      core::string<char>::operator+=
                ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),
                 (char)((ulong)in_stack_fffffffffffffe88 >> 0x38));
      core::string<char>::operator+=
                ((string<char> *)CONCAT17(uVar3,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
                );
    }
    std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::~list
              ((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)0x382259)
    ;
    std::__cxx11::list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::~list
              ((list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)0x382266)
    ;
    core::string<char>::~string((string<char> *)0x382273);
    core::string<char>::~string((string<char> *)0x382280);
    core::string<char>::~string((string<char> *)0x38228d);
  }
  return in_RDI;
}

Assistant:

path CFileSystem::getRelativeFilename(const path &filename, const path &directory) const
{
	if (filename.empty() || directory.empty())
		return filename;

	io::path path1, file, ext;
	core::splitFilename(getAbsolutePath(filename), &path1, &file, &ext);
	io::path path2(getAbsolutePath(directory));
	std::list<io::path> list1, list2;
	path1.split(list1, _IRR_TEXT("/\\"), 2);
	path2.split(list2, _IRR_TEXT("/\\"), 2);
	std::list<io::path>::const_iterator it1, it2;
	it1 = list1.begin();
	it2 = list2.begin();

#if defined(_IRR_WINDOWS_API_)
	fschar_t partition1 = 0, partition2 = 0;
	io::path prefix1, prefix2;
	if (it1 != list1.end())
		prefix1 = *it1;
	if (it2 != list2.end())
		prefix2 = *it2;
	if (prefix1.size() > 1 && prefix1[1] == _IRR_TEXT(':'))
		partition1 = core::locale_lower(prefix1[0]);
	if (prefix2.size() > 1 && prefix2[1] == _IRR_TEXT(':'))
		partition2 = core::locale_lower(prefix2[0]);

	// must have the same prefix or we can't resolve it to a relative filename
	if (partition1 != partition2) {
		return filename;
	}
#endif

	for (; it1 != list1.end() && it2 != list2.end()
#if defined(_IRR_WINDOWS_API_)
			&& (io::path(*it1).make_lower() == io::path(*it2).make_lower())
#else
			&& (*it1 == *it2)
#endif
					;) {
		++it1;
		++it2;
	}
	path1 = _IRR_TEXT("");
	for (; it2 != list2.end(); ++it2)
		path1 += _IRR_TEXT("../");
	while (it1 != list1.end()) {
		path1 += *it1++;
		path1 += _IRR_TEXT('/');
	}
	path1 += file;
	if (ext.size()) {
		path1 += _IRR_TEXT('.');
		path1 += ext;
	}
	return path1;
}